

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

vector<std::reference_wrapper<duckdb::Binding>,_true> * __thiscall
duckdb::BindContext::GetBindings
          (vector<std::reference_wrapper<duckdb::Binding>,_true> *__return_storage_ptr__,
          BindContext *this,BindingAlias *alias,ErrorData *out_error)

{
  pointer puVar1;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *puVar2;
  bool bVar3;
  pointer pBVar4;
  string *psVar5;
  InternalException *this_00;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *binding_1;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *binding;
  pointer this_02;
  allocator local_171;
  ErrorData *local_170;
  string local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  candidates;
  string candidate_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0 [32];
  ErrorData local_b0;
  
  local_170 = out_error;
  if ((alias->alias)._M_string_length != 0) {
    (__return_storage_ptr__->
    super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ).
    super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ).
    super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ).
    super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar1 = (this->bindings_list).
             super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (this->bindings_list).
                   super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1;
        this_02 = this_02 + 1) {
      pBVar4 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator->
                         (this_02);
      bVar3 = BindingAlias::Matches(&pBVar4->alias,alias);
      if (bVar3) {
        local_b0._0_8_ =
             unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator*
                       (this_02);
        ::std::
        vector<std::reference_wrapper<duckdb::Binding>,std::allocator<std::reference_wrapper<duckdb::Binding>>>
        ::emplace_back<std::reference_wrapper<duckdb::Binding>>
                  ((vector<std::reference_wrapper<duckdb::Binding>,std::allocator<std::reference_wrapper<duckdb::Binding>>>
                    *)__return_storage_ptr__,(reference_wrapper<duckdb::Binding> *)&local_b0);
      }
    }
    if ((__return_storage_ptr__->
        super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
        ).
        super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->
        super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
        ).
        super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      candidates.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      candidates.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      candidates.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar2 = (this->bindings_list).
               super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_01 = (this->bindings_list).
                     super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar2;
          this_01 = this_01 + 1) {
        pBVar4 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator->
                           (this_01);
        psVar5 = BindingAlias::GetAlias_abi_cxx11_(&pBVar4->alias);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&candidates,psVar5);
      }
      psVar5 = BindingAlias::GetAlias_abi_cxx11_(alias);
      StringUtil::TopNJaroWinkler
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_168,&candidates,psVar5,5,0.5);
      ::std::__cxx11::string::string((string *)&local_b0,"Candidate tables",&local_171);
      StringUtil::CandidatesMessage
                (&candidate_str,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_168,(string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_168);
      ::std::__cxx11::string::string(local_d0,"Referenced table \"%s\" not found!%s",&local_171);
      psVar5 = BindingAlias::GetAlias_abi_cxx11_(alias);
      ::std::__cxx11::string::string((string *)&local_f0,(string *)psVar5);
      ::std::__cxx11::string::string((string *)&local_110,(string *)&candidate_str);
      StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                (&local_168,(StringUtil *)local_d0,&local_f0,&local_110,in_R8);
      ErrorData::ErrorData(&local_b0,BINDER,&local_168);
      ErrorData::operator=(local_170,&local_b0);
      ErrorData::~ErrorData(&local_b0);
      ::std::__cxx11::string::~string((string *)&local_168);
      ::std::__cxx11::string::~string((string *)&local_110);
      ::std::__cxx11::string::~string((string *)&local_f0);
      ::std::__cxx11::string::~string(local_d0);
      ::std::__cxx11::string::~string((string *)&candidate_str);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&candidates);
    }
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_b0,"BindingAlias is not set",(allocator *)&candidate_str);
  InternalException::InternalException(this_00,(string *)&local_b0);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<reference<Binding>> BindContext::GetBindings(const BindingAlias &alias, ErrorData &out_error) {
	if (!alias.IsSet()) {
		throw InternalException("BindingAlias is not set");
	}
	vector<reference<Binding>> matching_bindings;
	for (auto &binding : bindings_list) {
		if (binding->alias.Matches(alias)) {
			matching_bindings.push_back(*binding);
		}
	}
	if (matching_bindings.empty()) {
		// alias not found in this BindContext
		vector<string> candidates;
		for (auto &binding : bindings_list) {
			candidates.push_back(binding->alias.GetAlias());
		}
		string candidate_str = StringUtil::CandidatesMessage(StringUtil::TopNJaroWinkler(candidates, alias.GetAlias()),
		                                                     "Candidate tables");
		out_error = ErrorData(ExceptionType::BINDER, StringUtil::Format("Referenced table \"%s\" not found!%s",
		                                                                alias.GetAlias(), candidate_str));
	}
	return matching_bindings;
}